

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

bool __thiscall QHttpSocketEngine::readHttpHeader(QHttpSocketEngine *this)

{
  QHttpNetworkReply *pQVar1;
  uint uVar2;
  QHttpSocketEnginePrivate *pQVar3;
  QHttpNetworkReplyPrivate *pQVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  int contentLength;
  bool ok;
  QHttpSocketEnginePrivate *d;
  bool contentLengthOk;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar6;
  bool local_51;
  QIODevice *in_stack_ffffffffffffffb0;
  QHttpNetworkReplyPrivate *in_stack_ffffffffffffffb8;
  undefined8 local_38;
  undefined8 local_30;
  bool local_28 [24];
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  byte bVar7;
  QHttpNetworkReplyPrivate *this_00;
  
  this_00 = *(QHttpNetworkReplyPrivate **)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QHttpSocketEngine *)0x33b2bb);
  if (pQVar3->state == ReadResponseHeader) {
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
    pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b2ee);
    if (pQVar4->state == NothingDoneState) {
      QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b308);
      QHttpNetworkReplyPrivate::clearHttpLayerInformation((QHttpNetworkReplyPrivate *)0x33b310);
      pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b321);
      pQVar4->state = ReadingStatusState;
    }
    pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b33c);
    if (pQVar4->state == ReadingStatusState) {
      QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b356);
      qVar5 = QHttpNetworkReplyPrivate::readStatus
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      uVar6 = CONCAT13(qVar5 != -1,(int3)uVar6);
      if ((qVar5 != -1) &&
         (pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b38f),
         pQVar4->state == ReadingStatusState)) {
        local_51 = true;
        goto LAB_0033b4ec;
      }
    }
    if (((uVar6 & 0x1000000) != 0) &&
       (pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b3bc),
       pQVar4->state == ReadingHeaderState)) {
      QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b3d6);
      qVar5 = QHttpNetworkReplyPrivate::readHeader
                        (this_00,(QIODevice *)
                                 CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
      uVar6 = CONCAT13(qVar5 != -1,(int3)uVar6);
      if ((qVar5 != -1) &&
         (pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x33b40f),
         pQVar4->state == ReadingHeaderState)) {
        local_51 = true;
        goto LAB_0033b4ec;
      }
    }
    if ((uVar6 & 0x1000000) != 0) {
      bVar7 = 0;
      pQVar1 = pQVar3->reply;
      QByteArrayView::QByteArrayView<15ul>
                ((QByteArrayView *)CONCAT44(uVar6,in_stack_ffffffffffffff90),
                 (char (*) [15])CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QByteArray::QByteArray((QByteArray *)0x33b460);
      (**(code **)(*(long *)pQVar1 + 0x98))
                (local_28,pQVar1,local_38,local_30,&stack0xffffffffffffffb0);
      uVar2 = QByteArray::toInt(local_28,(int)&stack0xfffffffffffffff7);
      QByteArray::~QByteArray((QByteArray *)0x33b4a4);
      QByteArray::~QByteArray((QByteArray *)0x33b4ae);
      if (((bVar7 & 1) != 0) && (0 < (int)uVar2)) {
        pQVar3->pendingResponseData = uVar2;
      }
      pQVar3->state = ReadResponseContent;
    }
    local_51 = (bool)((byte)(uVar6 >> 0x18) & 1);
  }
  else {
    local_51 = false;
  }
LAB_0033b4ec:
  if (*(QHttpNetworkReplyPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QHttpSocketEngine::readHttpHeader()
{
    Q_D(QHttpSocketEngine);

    if (d->state != ReadResponseHeader)
        return false;

    bool ok = true;
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::NothingDoneState) {
        // do not keep old content sizes, status etc. around
        d->reply->d_func()->clearHttpLayerInformation();
        d->reply->d_func()->state = QHttpNetworkReplyPrivate::ReadingStatusState;
    }
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState) {
        ok = d->reply->d_func()->readStatus(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState) {
        ok = d->reply->d_func()->readHeader(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok) {
        bool contentLengthOk;
        int contentLength = d->reply->headerField("Content-Length").toInt(&contentLengthOk);
        if (contentLengthOk && contentLength > 0)
            d->pendingResponseData = contentLength;
        d->state = ReadResponseContent; // we are done reading the header
    }
    return ok;
}